

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve25519.cc
# Opt level: O0

void X25519_public_from_private(uint8_t *out_public_value,uint8_t *private_key)

{
  undefined1 local_150 [8];
  fe zminusy_inv;
  fe_loose zminusy;
  fe_loose zplusy;
  ge_p3 A;
  uint8_t e [32];
  uint8_t *private_key_local;
  uint8_t *out_public_value_local;
  
  OPENSSL_memcpy(A.T.v + 4,private_key,0x20);
  A.T.v[4]._0_1_ = (byte)A.T.v[4] & 0xf8;
  x25519_ge_scalarmult_base((ge_p3 *)(zplusy.v + 4),(uint8_t *)(A.T.v + 4));
  fe_add((fe_loose *)(zminusy.v + 4),(fe *)(A.Y.v + 4),(fe *)(A.X.v + 4));
  fe_sub((fe_loose *)(zminusy_inv.v + 4),(fe *)(A.Y.v + 4),(fe *)(A.X.v + 4));
  fe_loose_invert((fe *)local_150,(fe_loose *)(zminusy_inv.v + 4));
  fe_mul_tlt((fe *)local_150,(fe_loose *)(zminusy.v + 4),(fe *)local_150);
  fe_tobytes(out_public_value,(fe *)local_150);
  return;
}

Assistant:

void X25519_public_from_private(uint8_t out_public_value[32],
                                const uint8_t private_key[32]) {
#if defined(BORINGSSL_X25519_NEON)
  if (CRYPTO_is_NEON_capable()) {
    static const uint8_t kMongomeryBasePoint[32] = {9};
    x25519_NEON(out_public_value, private_key, kMongomeryBasePoint);
    return;
  }
#endif

  uint8_t e[32];
  OPENSSL_memcpy(e, private_key, 32);
  e[0] &= 248;
  e[31] &= 127;
  e[31] |= 64;

  ge_p3 A;
  x25519_ge_scalarmult_base(&A, e);

  // We only need the u-coordinate of the curve25519 point. The map is
  // u=(y+1)/(1-y). Since y=Y/Z, this gives u=(Z+Y)/(Z-Y).
  fe_loose zplusy, zminusy;
  fe zminusy_inv;
  fe_add(&zplusy, &A.Z, &A.Y);
  fe_sub(&zminusy, &A.Z, &A.Y);
  fe_loose_invert(&zminusy_inv, &zminusy);
  fe_mul_tlt(&zminusy_inv, &zplusy, &zminusy_inv);
  fe_tobytes(out_public_value, &zminusy_inv);
  CONSTTIME_DECLASSIFY(out_public_value, 32);
}